

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_ObjAlloc(Cba_Ntk_t *p,Cba_ObjType_t Type,int nFins,int nFons)

{
  int Entry;
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  
  Entry = (p->vObjType).nSize;
  if (Type == CBA_OBJ_PI) {
    lVar3 = 0x18;
  }
  else {
    iVar4 = Entry;
    if (Type != CBA_OBJ_PO) goto LAB_003e8af3;
    lVar3 = 0x28;
  }
  Vec_IntPush((Vec_Int_t *)((long)&p->pDesign + lVar3),Entry);
  iVar4 = (p->vObjType).nSize;
LAB_003e8af3:
  if (iVar4 == (p->vObjType).nCap) {
    if (iVar4 < 0x10) {
      pcVar2 = (p->vObjType).pArray;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(pcVar2,0x10);
      }
      (p->vObjType).pArray = pcVar2;
      (p->vObjType).nCap = 0x10;
    }
    else {
      uVar1 = iVar4 * 2;
      pcVar2 = (p->vObjType).pArray;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)malloc((ulong)uVar1);
      }
      else {
        pcVar2 = (char *)realloc(pcVar2,(ulong)uVar1);
      }
      (p->vObjType).pArray = pcVar2;
      (p->vObjType).nCap = uVar1;
    }
  }
  else {
    pcVar2 = (p->vObjType).pArray;
  }
  iVar4 = (p->vObjType).nSize;
  (p->vObjType).nSize = iVar4 + 1;
  pcVar2[iVar4] = (char)Type;
  if (0 < nFins) {
    do {
      Vec_IntPush(&p->vFinFon,0);
      nFins = nFins + -1;
    } while (nFins != 0);
  }
  if ((p->vObjFin0).nSize != 0) {
    Vec_IntPush(&p->vObjFin0,(p->vFinFon).nSize);
  }
  if (0 < nFons) {
    do {
      Vec_IntPush(&p->vFonObj,Entry);
      nFons = nFons + -1;
    } while (nFons != 0);
  }
  if ((p->vObjFon0).nSize != 0) {
    Vec_IntPush(&p->vObjFon0,(p->vFonObj).nSize);
  }
  return Entry;
}

Assistant:

static inline int Cba_ObjAlloc( Cba_Ntk_t * p, Cba_ObjType_t Type, int nFins, int nFons )
{
    int i, iObj = Vec_StrSize(&p->vObjType);
    if ( Type == CBA_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == CBA_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vObjType, (char)Type );
    // add fins
    for ( i = 0; i < nFins; i++ )
        Vec_IntPush( &p->vFinFon, 0 );
    if ( Vec_IntSize(&p->vObjFin0) )
        Vec_IntPush( &p->vObjFin0, Vec_IntSize(&p->vFinFon) );
    // add fons
    for ( i = 0; i < nFons; i++ )
        Vec_IntPush( &p->vFonObj, iObj );
    if ( Vec_IntSize(&p->vObjFon0) )
        Vec_IntPush( &p->vObjFon0, Vec_IntSize(&p->vFonObj) );
    return iObj;
}